

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O2

int IDASolveF(void *ida_mem,sunrealtype tout,sunrealtype *tret,N_Vector yret,N_Vector ypret,
             int itask,int *ncheckPtr)

{
  sunrealtype sVar1;
  double dVar2;
  sunrealtype *psVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  sunrealtype sVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  IDAckpntMem pIVar11;
  long lVar12;
  long lVar13;
  undefined8 *puVar14;
  int iVar15;
  double *pdVar16;
  long lVar17;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar10 = -0x14;
    ida_mem = (IDAMem)0x0;
    iVar8 = 0x181;
    goto LAB_00118b4d;
  }
  if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    iVar10 = -0x65;
    iVar8 = 0x18c;
    goto LAB_00118b4d;
  }
  if (yret == (N_Vector)0x0) {
    msgfmt = "yret = NULL illegal.";
    iVar10 = -0x16;
    iVar8 = 0x196;
    goto LAB_00118b4d;
  }
  if (ypret == (N_Vector)0x0) {
    msgfmt = "ypret = NULL illegal.";
    iVar10 = -0x16;
    iVar8 = 0x19f;
    goto LAB_00118b4d;
  }
  if (tret == (sunrealtype *)0x0) {
    msgfmt = "tret = NULL illegal.";
    iVar10 = -0x16;
    iVar8 = 0x1a7;
    goto LAB_00118b4d;
  }
  if (itask - 3U < 0xfffffffe) {
    msgfmt = "itask has an illegal value.";
    iVar10 = -0x16;
    iVar8 = 0x1b0;
    goto LAB_00118b4d;
  }
  psVar3 = *(sunrealtype **)((long)ida_mem + 0x840);
  if (*(int *)((long)ida_mem + 0x4a8) != 0) {
    *(undefined4 *)((long)psVar3 + 0x14) = 1;
    psVar3[3] = *(sunrealtype *)((long)ida_mem + 0x4b0);
  }
  puVar4 = (undefined8 *)psVar3[0xf];
  if (*(int *)(psVar3 + 2) != 0) {
    sVar1 = *(sunrealtype *)((long)ida_mem + 0x4f8);
    *psVar3 = sVar1;
    pIVar11 = (IDAckpntMem)malloc(600);
    if (pIVar11 != (IDAckpntMem)0x0) {
      pIVar11->ck_t0 = sVar1;
      pIVar11->ck_nst = 0;
      pIVar11->ck_kk = 1;
      pIVar11->ck_hh = 0.0;
      if (*(int *)((long)ida_mem + 0x60) == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (uint)(*(int *)((long)ida_mem + 0x78) != 0);
      }
      pIVar11->ck_quadr = uVar9;
      iVar8 = *(int *)((long)ida_mem + 0x9c);
      pIVar11->ck_sensi = iVar8;
      if (iVar8 != 0) {
        pIVar11->ck_Ns = *(int *)((long)ida_mem + 0xa0);
      }
      if (*(int *)((long)ida_mem + 0x110) == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (uint)(*(int *)((long)ida_mem + 300) != 0);
      }
      pIVar11->ck_quadr_sensi = uVar9;
      pIVar11->ck_phi_alloc = 3;
      iVar8 = IDAAckpntAllocVectors((IDAMem)ida_mem,pIVar11);
      if (iVar8 != 0) {
        IDAAckpntCopyVectors((IDAMem)ida_mem,pIVar11);
        pIVar11->ck_next = (IDAckpntMemRec *)0x0;
        psVar3[10] = (sunrealtype)pIVar11;
        if (*(int *)(psVar3 + 0x16) == 0) {
          if (*(int *)((long)ida_mem + 0x9c) == 0) {
            *(undefined4 *)(psVar3 + 0x17) = 0;
          }
          iVar8 = (*(code *)psVar3[0x14])(ida_mem);
          if (iVar8 == 0) {
            msgfmt = "A memory request failed.";
            iVar10 = -0x15;
            iVar8 = 0x1dd;
            goto LAB_00118b4d;
          }
          for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
            psVar3[lVar12 + 0x19] = *(sunrealtype *)((long)ida_mem + lVar12 * 8 + 0x158);
          }
          if (*(int *)(psVar3 + 0x17) != 0) {
            for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
              psVar3[lVar12 + 0x1f] = *(sunrealtype *)((long)ida_mem + lVar12 * 8 + 0x350);
            }
          }
          *(undefined4 *)(psVar3 + 0x16) = 1;
          pIVar11 = (IDAckpntMem)psVar3[10];
        }
        *(sunrealtype *)*puVar4 = pIVar11->ck_t0;
        (*(code *)psVar3[0x12])(ida_mem);
        *(undefined4 *)(psVar3 + 2) = 0;
        goto LAB_00118be2;
      }
      free(pIVar11);
    }
    psVar3[10] = 0.0;
    msgfmt = "A memory request failed.";
    iVar10 = -0x15;
    iVar8 = 0x1ce;
LAB_00118b4d:
    IDAProcessError((IDAMem)ida_mem,iVar10,iVar8,"IDASolveF",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,msgfmt);
    return iVar10;
  }
  if (itask == 1) {
    pdVar16 = psVar3 + 5;
    if (*(int *)(psVar3 + 4) == 0) {
      pdVar16 = (double *)((long)ida_mem + 0x4f8);
    }
    if (0.0 <= (*pdVar16 - tout) * *(double *)((long)ida_mem + 0x4e0)) {
      *tret = tout;
      iVar8 = IDAGetSolution(ida_mem,tout,yret,ypret);
      goto LAB_00118f2f;
    }
    if (*(int *)(psVar3 + 4) != 0) {
      sVar1 = psVar3[5];
      *tret = sVar1;
      IDAGetSolution(ida_mem,sVar1,yret,ypret);
      *(undefined4 *)(psVar3 + 4) = 0;
      iVar8 = 2;
      goto LAB_00118f2f;
    }
  }
LAB_00118be2:
  lVar12 = 0;
  do {
    if (*(long *)((long)ida_mem + 0x568) <= lVar12 && 0 < *(long *)((long)ida_mem + 0x568)) {
      iVar8 = -1;
      IDAProcessError((IDAMem)ida_mem,-1,0x22a,"IDASolveF",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"At t = %.15g, mxstep steps taken before reaching tout.",
                      *(undefined8 *)((long)ida_mem + 0x4f8));
      break;
    }
    iVar8 = IDASolve(ida_mem,tout,tret,yret,ypret,2);
    if (iVar8 < 0) break;
    lVar13 = *(long *)((long)ida_mem + 0x5b8);
    lVar17 = lVar13 % (long)psVar3[0xd];
    sVar1 = *(sunrealtype *)((long)ida_mem + 0x4f8);
    if (lVar17 == 0) {
      *(sunrealtype *)((long)psVar3[10] + 8) = sVar1;
      pIVar11 = (IDAckpntMem)malloc(600);
      if (pIVar11 != (IDAckpntMem)0x0) {
        pIVar11->ck_nst = lVar13;
        pIVar11->ck_tretlast = *(sunrealtype *)((long)ida_mem + 0x500);
        iVar10 = *(int *)((long)ida_mem + 0x4b8);
        iVar15 = *(int *)((long)ida_mem + 0x4bc);
        iVar5 = *(int *)((long)ida_mem + 0x4c0);
        iVar6 = *(int *)((long)ida_mem + 0x4c4);
        pIVar11->ck_kk = iVar10;
        pIVar11->ck_kused = iVar15;
        pIVar11->ck_knew = iVar5;
        pIVar11->ck_phase = iVar6;
        pIVar11->ck_ns = *(int *)((long)ida_mem + 0x4c8);
        sVar7 = *(sunrealtype *)((long)ida_mem + 0x4e8);
        pIVar11->ck_hh = *(sunrealtype *)((long)ida_mem + 0x4e0);
        pIVar11->ck_hused = sVar7;
        pIVar11->ck_eta = *(sunrealtype *)((long)ida_mem + 0x4f0);
        sVar7 = *(sunrealtype *)((long)ida_mem + 0x510);
        pIVar11->ck_cj = *(sunrealtype *)((long)ida_mem + 0x508);
        pIVar11->ck_cjlast = sVar7;
        sVar7 = *(sunrealtype *)((long)ida_mem + 0x520);
        pIVar11->ck_cjold = *(sunrealtype *)((long)ida_mem + 0x518);
        pIVar11->ck_cjratio = sVar7;
        pIVar11->ck_ss = *(sunrealtype *)((long)ida_mem + 0x528);
        pIVar11->ck_ssS = *(sunrealtype *)((long)ida_mem + 0x550);
        pIVar11->ck_t0 = sVar1;
        for (lVar13 = 0x2b; lVar13 != 0x31; lVar13 = lVar13 + 1) {
          pIVar11->ck_phi[lVar13 + -2] = *(N_Vector *)((long)ida_mem + lVar13 * 8 + 0x30);
          pIVar11->ck_phi[lVar13 + 4] = *(N_Vector *)((long)ida_mem + lVar13 * 8 + 0x60);
          pIVar11->ck_phiQ[lVar13 + 3] = *(N_Vector *)((long)ida_mem + lVar13 * 8 + 0x90);
          pIVar11->ck_phiS[lVar13 + 2] = *(N_Vector **)((long)ida_mem + lVar13 * 8 + 0xc0);
          pIVar11->ck_phiQS[lVar13 + 1] = *(N_Vector **)((long)ida_mem + lVar13 * 8 + 0xf0);
        }
        if (*(int *)((long)ida_mem + 0x60) == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (uint)(*(int *)((long)ida_mem + 0x78) != 0);
        }
        pIVar11->ck_quadr = uVar9;
        iVar15 = *(int *)((long)ida_mem + 0x9c);
        pIVar11->ck_sensi = iVar15;
        if (iVar15 != 0) {
          pIVar11->ck_Ns = *(int *)((long)ida_mem + 0xa0);
        }
        if (*(int *)((long)ida_mem + 0x110) == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (uint)(*(int *)((long)ida_mem + 300) != 0);
        }
        pIVar11->ck_quadr_sensi = uVar9;
        iVar15 = iVar10 + 2;
        if (3 < iVar10) {
          iVar15 = 6;
        }
        pIVar11->ck_phi_alloc = iVar15;
        iVar10 = IDAAckpntAllocVectors((IDAMem)ida_mem,pIVar11);
        if (iVar10 != 0) {
          IDAAckpntCopyVectors((IDAMem)ida_mem,pIVar11);
          pIVar11->ck_next = (IDAckpntMemRec *)psVar3[10];
          psVar3[10] = (sunrealtype)pIVar11;
          *(int *)(psVar3 + 0xc) = *(int *)(psVar3 + 0xc) + 1;
          *(undefined4 *)((long)ida_mem + 0x770) = 1;
          sVar1 = pIVar11->ck_t0;
          puVar14 = puVar4;
          goto LAB_00118e17;
        }
        free(pIVar11);
      }
      iVar8 = -0x15;
      break;
    }
    puVar14 = puVar4 + lVar17;
LAB_00118e17:
    *(sunrealtype *)*puVar14 = sVar1;
    (*(code *)psVar3[0x12])(ida_mem);
    sVar1 = *(sunrealtype *)((long)ida_mem + 0x4f8);
    *(sunrealtype *)((long)psVar3[10] + 8) = sVar1;
    psVar3[1] = sVar1;
    if (itask == 2) break;
    dVar2 = *tret;
    if (0.0 <= (dVar2 - tout) * *(double *)((long)ida_mem + 0x4e0)) {
      if (iVar8 == 2) {
        *(undefined4 *)(psVar3 + 4) = 1;
        psVar3[5] = dVar2;
      }
      *tret = tout;
      iVar8 = IDAGetSolution(ida_mem,tout,yret,ypret);
      *(sunrealtype *)((long)ida_mem + 0x500) = tout;
      break;
    }
    lVar12 = lVar12 + 1;
  } while (1 < iVar8 - 1U);
LAB_00118f2f:
  *ncheckPtr = *(int *)(psVar3 + 0xc);
  *(undefined4 *)((long)psVar3 + 0xb4) = 1;
  psVar3[0xb] = psVar3[10];
  psVar3[0x10] = (sunrealtype)(*(long *)((long)ida_mem + 0x5b8) % (long)psVar3[0xd] + 1);
  return iVar8;
}

Assistant:

int IDASolveF(void* ida_mem, sunrealtype tout, sunrealtype* tret, N_Vector yret,
              N_Vector ypret, int itask, int* ncheckPtr)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDAckpntMem tmp;
  IDAdtpntMem* dt_mem;
  long int nstloc;
  int flag, i;
  sunbooleantype allocOK, earlyret;
  sunrealtype ttest;

  /* Is the mem OK? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Is ASA initialized ? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check for yret != NULL */
  if (yret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_YRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Check for ypret != NULL */
  if (ypret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_YPRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  /* Check for tret != NULL */
  if (tret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_TRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Check for valid itask */
  if ((itask != IDA_NORMAL) && (itask != IDA_ONE_STEP))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ITASK);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* All memory checks done, proceed ... */

  dt_mem = IDAADJ_mem->dt_mem;

  /* If tstop is enabled, store some info */
  if (IDA_mem->ida_tstopset)
  {
    IDAADJ_mem->ia_tstopIDAFcall = SUNTRUE;
    IDAADJ_mem->ia_tstopIDAF     = IDA_mem->ida_tstop;
  }

  /* On the first step:
   *   - set tinitial
   *   - initialize list of check points
   *   - if needed, initialize the interpolation module
   *   - load dt_mem[0]
   * On subsequent steps, test if taking a new step is necessary.
   */
  if (IDAADJ_mem->ia_firstIDAFcall)
  {
    IDAADJ_mem->ia_tinitial = IDA_mem->ida_tn;
    IDAADJ_mem->ck_mem      = IDAAckpntInit(IDA_mem);
    if (IDAADJ_mem->ck_mem == NULL)
    {
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (IDA_MEM_FAIL);
    }

    if (!IDAADJ_mem->ia_mallocDone)
    {
      /* Do we need to store sensitivities? */
      if (!IDA_mem->ida_sensi) { IDAADJ_mem->ia_storeSensi = SUNFALSE; }

      /* Allocate space for interpolation data */
      allocOK = IDAADJ_mem->ia_malloc(IDA_mem);
      if (!allocOK)
      {
        IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_MEM_FAIL);
        SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
        return (IDA_MEM_FAIL);
      }

      /* Rename phi and, if needed, phiS for use in interpolation */
      for (i = 0; i < MXORDP1; i++)
      {
        IDAADJ_mem->ia_Y[i] = IDA_mem->ida_phi[i];
      }
      if (IDAADJ_mem->ia_storeSensi)
      {
        for (i = 0; i < MXORDP1; i++)
        {
          IDAADJ_mem->ia_YS[i] = IDA_mem->ida_phiS[i];
        }
      }

      IDAADJ_mem->ia_mallocDone = SUNTRUE;
    }

    dt_mem[0]->t = IDAADJ_mem->ck_mem->ck_t0;
    IDAADJ_mem->ia_storePnt(IDA_mem, dt_mem[0]);

    IDAADJ_mem->ia_firstIDAFcall = SUNFALSE;
  }
  else if (itask == IDA_NORMAL)
  {
    /* When in normal mode, check if tout was passed or if a previous root was
       not reported and return an interpolated solution. No changes to ck_mem
       or dt_mem are needed. */

    /* flag to signal if an early return is needed */
    earlyret = SUNFALSE;

    /* if a root needs to be reported compare tout to troot otherwise compare
       to the current time tn */
    ttest = (IDAADJ_mem->ia_rootret) ? IDAADJ_mem->ia_troot : IDA_mem->ida_tn;

    if ((ttest - tout) * IDA_mem->ida_hh >= ZERO)
    {
      /* ttest is after tout, interpolate to tout */
      *tret    = tout;
      flag     = IDAGetSolution(IDA_mem, tout, yret, ypret);
      earlyret = SUNTRUE;
    }
    else if (IDAADJ_mem->ia_rootret)
    {
      /* tout is after troot, interpolate to troot */
      *tret = IDAADJ_mem->ia_troot;
      flag  = IDAGetSolution(IDA_mem, IDAADJ_mem->ia_troot, yret, ypret);
      flag  = IDA_ROOT_RETURN;
      IDAADJ_mem->ia_rootret = SUNFALSE;
      earlyret               = SUNTRUE;
    }

    /* return if necessary */
    if (earlyret)
    {
      *ncheckPtr               = IDAADJ_mem->ia_nckpnts;
      IDAADJ_mem->ia_newData   = SUNTRUE;
      IDAADJ_mem->ia_ckpntData = IDAADJ_mem->ck_mem;
      IDAADJ_mem->ia_np        = IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps + 1;
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (flag);
    }
  }

  /* Integrate to tout (in IDA_ONE_STEP mode) while loading check points */
  nstloc = 0;
  for (;;)
  {
    /* Check for too many steps */

    if ((IDA_mem->ida_mxstep > 0) && (nstloc >= IDA_mem->ida_mxstep))
    {
      IDAProcessError(IDA_mem, IDA_TOO_MUCH_WORK, __LINE__, __func__, __FILE__,
                      MSG_MAX_STEPS, IDA_mem->ida_tn);
      flag = IDA_TOO_MUCH_WORK;
      break;
    }

    /* Perform one step of the integration */

    flag = IDASolve(IDA_mem, tout, tret, yret, ypret, IDA_ONE_STEP);
    if (flag < 0) { break; }

    nstloc++;

    /* Test if a new check point is needed */

    if (IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps == 0)
    {
      IDAADJ_mem->ck_mem->ck_t1 = IDA_mem->ida_tn;

      /* Create a new check point, load it, and append it to the list */
      tmp = IDAAckpntNew(IDA_mem);
      if (tmp == NULL)
      {
        flag = IDA_MEM_FAIL;
        break;
      }

      tmp->ck_next       = IDAADJ_mem->ck_mem;
      IDAADJ_mem->ck_mem = tmp;
      IDAADJ_mem->ia_nckpnts++;

      IDA_mem->ida_forceSetup = SUNTRUE;

      /* Reset i=0 and load dt_mem[0] */
      dt_mem[0]->t = IDAADJ_mem->ck_mem->ck_t0;
      IDAADJ_mem->ia_storePnt(IDA_mem, dt_mem[0]);
    }
    else
    {
      /* Load next point in dt_mem */
      dt_mem[IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps]->t = IDA_mem->ida_tn;
      IDAADJ_mem->ia_storePnt(IDA_mem,
                              dt_mem[IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps]);
    }

    /* Set t1 field of the current check point structure
       for the case in which there will be no future
       check points */
    IDAADJ_mem->ck_mem->ck_t1 = IDA_mem->ida_tn;

    /* tfinal is now set to tn */
    IDAADJ_mem->ia_tfinal = IDA_mem->ida_tn;

    /* Return if in IDA_ONE_STEP mode */
    if (itask == IDA_ONE_STEP) { break; }

    /* IDA_NORMAL_STEP returns */

    /* Return if tout reached */
    if ((*tret - tout) * IDA_mem->ida_hh >= ZERO)
    {
      /* If this was a root return, save the root time to return later */
      if (flag == IDA_ROOT_RETURN)
      {
        IDAADJ_mem->ia_rootret = SUNTRUE;
        IDAADJ_mem->ia_troot   = *tret;
      }

      /* Get solution value at tout to return now */
      *tret = tout;
      flag  = IDAGetSolution(IDA_mem, tout, yret, ypret);

      /* Reset tretlast in IDA_mem so that IDAGetQuad and IDAGetSens
       * evaluate quadratures and/or sensitivities at the proper time */
      IDA_mem->ida_tretlast = tout;

      break;
    }

    /* Return if tstop or a root was found */
    if ((flag == IDA_TSTOP_RETURN) || (flag == IDA_ROOT_RETURN)) { break; }

  } /* end of for(;;) */

  /* Get ncheck from IDAADJ_mem */
  *ncheckPtr = IDAADJ_mem->ia_nckpnts;

  /* Data is available for the last interval */
  IDAADJ_mem->ia_newData   = SUNTRUE;
  IDAADJ_mem->ia_ckpntData = IDAADJ_mem->ck_mem;
  IDAADJ_mem->ia_np        = IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps + 1;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (flag);
}